

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O1

int link_get_snd_settle_mode(LINK_HANDLE link,sender_settle_mode *snd_settle_mode)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (link == (LINK_HANDLE)0x0 || snd_settle_mode == (sender_settle_mode *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x3cb;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"link_get_snd_settle_mode",0x3ca,1,"Bad arguments: link = %p, snd_settle_mode = %p"
                ,link,snd_settle_mode);
    }
  }
  else {
    *snd_settle_mode = link->snd_settle_mode;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int link_get_snd_settle_mode(LINK_HANDLE link, sender_settle_mode* snd_settle_mode)
{
    int result;

    if ((link == NULL) ||
        (snd_settle_mode == NULL))
    {
        LogError("Bad arguments: link = %p, snd_settle_mode = %p",
            link, snd_settle_mode);
        result = MU_FAILURE;
    }
    else
    {
        *snd_settle_mode = link->snd_settle_mode;

        result = 0;
    }

    return result;
}